

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O1

int SaveEnv(void)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar2;
  interval *piVar3;
  long lVar4;
  char line [1024];
  byte local_438;
  char local_437;
  
  memset(&local_438,0,0x400);
  __stream = fopen("env.txt","r");
  if (__stream == (FILE *)0x0) {
LAB_0014debe:
    puts("Error saving configuration file.");
  }
  else {
    __stream_00 = fopen("~env.txt","w");
    if (__stream_00 != (FILE *)0x0) {
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014cf60;
          if (local_438 != 0x24) goto LAB_0014cf99;
LAB_0014cf87:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014cf60:
          if (pcVar2 == (char *)0x0) {
LAB_0014cf7b:
            if (local_438 == 0x24) goto LAB_0014cf87;
            goto LAB_0014cf99;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014cf99;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014cf7b;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014cf99:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : (M_PI/2.0-angle_env)*180.0/M_PI.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",
                      ((1.5707963267948966 - angle_env) * 180.0) / 3.141592653589793);
      if (iVar1 < 0) {
        puts("Error writing parameter : (M_PI/2.0-angle_env)*180.0/M_PI.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d030;
          if (local_438 != 0x24) goto LAB_0014d069;
LAB_0014d057:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d030:
          if (pcVar2 == (char *)0x0) {
LAB_0014d04b:
            if (local_438 == 0x24) goto LAB_0014d057;
            goto LAB_0014d069;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d069;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d04b;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d069:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : lat_env.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",lat_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : lat_env.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d0e8;
          if (local_438 != 0x24) goto LAB_0014d121;
LAB_0014d10f:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d0e8:
          if (pcVar2 == (char *)0x0) {
LAB_0014d103:
            if (local_438 == 0x24) goto LAB_0014d10f;
            goto LAB_0014d121;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d121;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d103;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d121:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : long_env.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",long_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : long_env.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d1a0;
          if (local_438 != 0x24) goto LAB_0014d1d9;
LAB_0014d1c7:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d1a0:
          if (pcVar2 == (char *)0x0) {
LAB_0014d1bb:
            if (local_438 == 0x24) goto LAB_0014d1c7;
            goto LAB_0014d1d9;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d1d9;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d1bb;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d1d9:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : alt_env.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",alt_env);
      if (iVar1 < 0) {
        puts("Error writing parameter : alt_env.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d258;
          if (local_438 != 0x24) goto LAB_0014d291;
LAB_0014d27f:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d258:
          if (pcVar2 == (char *)0x0) {
LAB_0014d273:
            if (local_438 == 0x24) goto LAB_0014d27f;
            goto LAB_0014d291;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d291;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d273;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d291:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : MagneticDeclination.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",MagneticDeclination);
      if (iVar1 < 0) {
        puts("Error writing parameter : MagneticDeclination.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d310;
          if (local_438 != 0x24) goto LAB_0014d349;
LAB_0014d337:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d310:
          if (pcVar2 == (char *)0x0) {
LAB_0014d32b:
            if (local_438 == 0x24) goto LAB_0014d337;
            goto LAB_0014d349;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d349;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d32b;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d349:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : AirPressure.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",AirPressure);
      if (iVar1 < 0) {
        puts("Error writing parameter : AirPressure.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d3c8;
          if (local_438 != 0x24) goto LAB_0014d401;
LAB_0014d3ef:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d3c8:
          if (pcVar2 == (char *)0x0) {
LAB_0014d3e3:
            if (local_438 == 0x24) goto LAB_0014d3ef;
            goto LAB_0014d401;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d401;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d3e3;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d401:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : WaterVelocityOfSound.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",WaterVelocityOfSound);
      if (iVar1 < 0) {
        puts("Error writing parameter : WaterVelocityOfSound.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d480;
          if (local_438 != 0x24) goto LAB_0014d4b9;
LAB_0014d4a7:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d480:
          if (pcVar2 == (char *)0x0) {
LAB_0014d49b:
            if (local_438 == 0x24) goto LAB_0014d4a7;
            goto LAB_0014d4b9;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d4b9;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d49b;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d4b9:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : WaterFloorAltitude.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",WaterFloorAltitude);
      if (iVar1 < 0) {
        puts("Error writing parameter : WaterFloorAltitude.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d538;
          if (local_438 != 0x24) goto LAB_0014d571;
LAB_0014d55f:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d538:
          if (pcVar2 == (char *)0x0) {
LAB_0014d553:
            if (local_438 == 0x24) goto LAB_0014d55f;
            goto LAB_0014d571;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d571;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d553;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d571:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : (int)circles_r.size().");
      }
      iVar1 = fprintf(__stream_00,"%d\n",
                      (ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar1 < 0) {
        puts("Error writing parameter : (int)circles_r.size().");
      }
      if (0 < (int)((ulong)((long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)circles_r.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar4 = 0;
LAB_0014d5d7:
        do {
          pcVar2 = fgets((char *)&local_438,0x400,__stream);
          if (local_438 < 0x25) {
            if (local_438 == 0x23) goto LAB_0014d614;
            if (local_438 != 0x24) goto LAB_0014d646;
LAB_0014d634:
            if (pcVar2 != (char *)0x0) {
              fputs((char *)&local_438,__stream_00);
            }
LAB_0014d644:
            pcVar2 = (char *)0x0;
          }
          else {
            if (local_438 == 0x25) {
LAB_0014d614:
              if (pcVar2 == (char *)0x0) goto LAB_0014d608;
LAB_0014d619:
              iVar1 = fprintf(__stream_00,"%s",&local_438);
              if (iVar1 < 0) goto LAB_0014d644;
              goto LAB_0014d5d7;
            }
            if (local_438 == 0x2f) {
              if ((pcVar2 != (char *)0x0) && (local_437 == '/')) goto LAB_0014d619;
LAB_0014d608:
              if (local_438 == 0x24) goto LAB_0014d634;
            }
          }
LAB_0014d646:
          if (pcVar2 == (char *)0x0) {
            puts("Invalid parameter : circles.");
          }
          iVar1 = fprintf(__stream_00,"%.10g %.10g %.10g\n",
                          circles_x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4],
                          circles_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4],
                          circles_r.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4]);
          if (iVar1 < 0) {
            puts("Error writing parameter : circles.");
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < (int)((ulong)((long)circles_r.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)circles_r.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d6fe;
          if (local_438 != 0x24) goto LAB_0014d737;
LAB_0014d725:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d6fe:
          if (pcVar2 == (char *)0x0) {
LAB_0014d719:
            if (local_438 == 0x24) goto LAB_0014d725;
            goto LAB_0014d737;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d737;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d719;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d737:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : (int)walls_xa.size().");
      }
      iVar1 = fprintf(__stream_00,"%d\n",
                      (ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar1 < 0) {
        puts("Error writing parameter : (int)walls_xa.size().");
      }
      if (0 < (int)((ulong)((long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)walls_xa.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar4 = 0;
LAB_0014d79d:
        do {
          pcVar2 = fgets((char *)&local_438,0x400,__stream);
          if (local_438 < 0x25) {
            if (local_438 == 0x23) goto LAB_0014d7da;
            if (local_438 != 0x24) goto LAB_0014d80c;
LAB_0014d7fa:
            if (pcVar2 != (char *)0x0) {
              fputs((char *)&local_438,__stream_00);
            }
LAB_0014d80a:
            pcVar2 = (char *)0x0;
          }
          else {
            if (local_438 == 0x25) {
LAB_0014d7da:
              if (pcVar2 == (char *)0x0) goto LAB_0014d7ce;
LAB_0014d7df:
              iVar1 = fprintf(__stream_00,"%s",&local_438);
              if (iVar1 < 0) goto LAB_0014d80a;
              goto LAB_0014d79d;
            }
            if (local_438 == 0x2f) {
              if ((pcVar2 != (char *)0x0) && (local_437 == '/')) goto LAB_0014d7df;
LAB_0014d7ce:
              if (local_438 == 0x24) goto LAB_0014d7fa;
            }
          }
LAB_0014d80c:
          if (pcVar2 == (char *)0x0) {
            puts("Invalid parameter : walls.");
          }
          iVar1 = fprintf(__stream_00,"%.10g %.10g %.10g %.10g\n",
                          walls_xa.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4],
                          walls_ya.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4],
                          walls_xb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4],
                          walls_yb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4]);
          if (iVar1 < 0) {
            puts("Error writing parameter : walls.");
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < (int)((ulong)((long)walls_xa.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)walls_xa.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d8d4;
          if (local_438 != 0x24) goto LAB_0014d90d;
LAB_0014d8fb:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d8d4:
          if (pcVar2 == (char *)0x0) {
LAB_0014d8ef:
            if (local_438 == 0x24) goto LAB_0014d8fb;
            goto LAB_0014d90d;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d90d;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d8ef;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d90d:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : box_env[0].inf.");
      }
      piVar3 = box::operator[](&box_env,0);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar3->inf);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[0].inf.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014d993;
          if (local_438 != 0x24) goto LAB_0014d9cc;
LAB_0014d9ba:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014d993:
          if (pcVar2 == (char *)0x0) {
LAB_0014d9ae:
            if (local_438 == 0x24) goto LAB_0014d9ba;
            goto LAB_0014d9cc;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014d9cc;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014d9ae;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014d9cc:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : box_env[0].sup.");
      }
      piVar3 = box::operator[](&box_env,0);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar3->sup);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[0].sup.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014da53;
          if (local_438 != 0x24) goto LAB_0014da8c;
LAB_0014da7a:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014da53:
          if (pcVar2 == (char *)0x0) {
LAB_0014da6e:
            if (local_438 == 0x24) goto LAB_0014da7a;
            goto LAB_0014da8c;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014da8c;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014da6e;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014da8c:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : box_env[1].inf.");
      }
      piVar3 = box::operator[](&box_env,1);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar3->inf);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[1].inf.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014db15;
          if (local_438 != 0x24) goto LAB_0014db4e;
LAB_0014db3c:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014db15:
          if (pcVar2 == (char *)0x0) {
LAB_0014db30:
            if (local_438 == 0x24) goto LAB_0014db3c;
            goto LAB_0014db4e;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014db4e;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014db30;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014db4e:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : box_env[1].sup.");
      }
      piVar3 = box::operator[](&box_env,1);
      iVar1 = fprintf(__stream_00,"%.10g\n",piVar3->sup);
      if (iVar1 < 0) {
        puts("Error writing parameter : box_env[1].sup.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014dbd8;
          if (local_438 != 0x24) goto LAB_0014dc11;
LAB_0014dbff:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014dbd8:
          if (pcVar2 == (char *)0x0) {
LAB_0014dbf3:
            if (local_438 == 0x24) goto LAB_0014dbff;
            goto LAB_0014dc11;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014dc11;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014dbf3;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014dc11:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : csMap.xMin.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMin);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMin.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014dc92;
          if (local_438 != 0x24) goto LAB_0014dccb;
LAB_0014dcb9:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014dc92:
          if (pcVar2 == (char *)0x0) {
LAB_0014dcad:
            if (local_438 == 0x24) goto LAB_0014dcb9;
            goto LAB_0014dccb;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014dccb;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014dcad;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014dccb:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : csMap.xMax.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMax);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMax.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014dd45;
          if (local_438 != 0x24) goto LAB_0014dd7e;
LAB_0014dd6c:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014dd45:
          if (pcVar2 == (char *)0x0) {
LAB_0014dd60:
            if (local_438 == 0x24) goto LAB_0014dd6c;
            goto LAB_0014dd7e;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014dd7e;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014dd60;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014dd7e:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : csMap.xMin.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMin);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMin.");
      }
      do {
        pcVar2 = fgets((char *)&local_438,0x400,__stream);
        if (local_438 < 0x25) {
          if (local_438 == 0x23) goto LAB_0014ddf8;
          if (local_438 != 0x24) goto LAB_0014de31;
LAB_0014de1f:
          if (pcVar2 != (char *)0x0) {
            fputs((char *)&local_438,__stream_00);
          }
          break;
        }
        if (local_438 == 0x25) {
LAB_0014ddf8:
          if (pcVar2 == (char *)0x0) {
LAB_0014de13:
            if (local_438 == 0x24) goto LAB_0014de1f;
            goto LAB_0014de31;
          }
        }
        else {
          if (local_438 != 0x2f) goto LAB_0014de31;
          if ((pcVar2 == (char *)0x0) || (local_437 != '/')) goto LAB_0014de13;
        }
        iVar1 = fprintf(__stream_00,"%s",&local_438);
      } while (-1 < iVar1);
      pcVar2 = (char *)0x0;
LAB_0014de31:
      if (pcVar2 == (char *)0x0) {
        puts("Invalid parameter : csMap.xMax.");
      }
      iVar1 = fprintf(__stream_00,"%.10g\n",csMap.xMax);
      if (iVar1 < 0) {
        puts("Error writing parameter : csMap.xMax.");
      }
      iVar1 = fclose(__stream_00);
      if (iVar1 == 0) {
        iVar1 = fclose(__stream);
        if (((iVar1 == 0) && (iVar1 = remove("env.txt"), iVar1 == 0)) &&
           (iVar1 = rename("~env.txt","env.txt"), iVar1 == 0)) {
          return 0;
        }
        goto LAB_0014debe;
      }
    }
    puts("Error saving configuration file.");
    fclose(__stream);
  }
  return 1;
}

Assistant:

inline int SaveEnv(void)
{
	FILE* filein = NULL;
	FILE* fileout = NULL;
	char line[1024];
	int i = 0;

	// Missing error checking...

	memset(line, 0, sizeof(line));

	filein = fopen("env.txt", "r");
	if (filein == NULL)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}
	fileout = fopen("~env.txt", "w");
	if (fileout == NULL)
	{
		printf("Error saving configuration file.\n");
		fclose(filein);
		return EXIT_FAILURE;
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");
	if (fprintf(fileout, "%.10g\n", (M_PI/2.0-angle_env)*180.0/M_PI) < 0) printf("Error writing parameter : (M_PI/2.0-angle_env)*180.0/M_PI.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : lat_env.\n");
	if (fprintf(fileout, "%.10g\n", lat_env) < 0) printf("Error writing parameter : lat_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : long_env.\n");
	if (fprintf(fileout, "%.10g\n", long_env) < 0) printf("Error writing parameter : long_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : alt_env.\n");
	if (fprintf(fileout, "%.10g\n", alt_env) < 0) printf("Error writing parameter : alt_env.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : MagneticDeclination.\n");
	if (fprintf(fileout, "%.10g\n", MagneticDeclination) < 0) printf("Error writing parameter : MagneticDeclination.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : AirPressure.\n");
	if (fprintf(fileout, "%.10g\n", AirPressure) < 0) printf("Error writing parameter : AirPressure.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : WaterVelocityOfSound.\n");
	if (fprintf(fileout, "%.10g\n", WaterVelocityOfSound) < 0) printf("Error writing parameter : WaterVelocityOfSound.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : WaterFloorAltitude.\n");
	if (fprintf(fileout, "%.10g\n", WaterFloorAltitude) < 0) printf("Error writing parameter : WaterFloorAltitude.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (int)circles_r.size().\n");
	if (fprintf(fileout, "%d\n", (int)circles_r.size()) < 0) printf("Error writing parameter : (int)circles_r.size().\n");
	for (i = 0; i < (int)circles_r.size(); i++)
	{
		if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : circles.\n");
		if (fprintf(fileout, "%.10g %.10g %.10g\n", circles_x[i], circles_y[i], circles_r[i]) < 0) printf("Error writing parameter : circles.\n");
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : (int)walls_xa.size().\n");
	if (fprintf(fileout, "%d\n", (int)walls_xa.size()) < 0) printf("Error writing parameter : (int)walls_xa.size().\n");
	for (i = 0; i < (int)walls_xa.size(); i++)
	{
		if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : walls.\n");
		if (fprintf(fileout, "%.10g %.10g %.10g %.10g\n", walls_xa[i], walls_ya[i], walls_xb[i], walls_yb[i]) < 0) printf("Error writing parameter : walls.\n");
	}

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[0].inf.\n");
	if (fprintf(fileout, "%.10g\n", box_env[0].inf) < 0) printf("Error writing parameter : box_env[0].inf.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[0].sup.\n");
	if (fprintf(fileout, "%.10g\n", box_env[0].sup) < 0) printf("Error writing parameter : box_env[0].sup.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[1].inf.\n");
	if (fprintf(fileout, "%.10g\n", box_env[1].inf) < 0) printf("Error writing parameter : box_env[1].inf.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : box_env[1].sup.\n");
	if (fprintf(fileout, "%.10g\n", box_env[1].sup) < 0) printf("Error writing parameter : box_env[1].sup.\n");

	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMin.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMin) < 0) printf("Error writing parameter : csMap.xMin.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMax.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMax) < 0) printf("Error writing parameter : csMap.xMax.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMin.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMin) < 0) printf("Error writing parameter : csMap.xMin.\n");
	if (fgetscopy3(filein, fileout, line, sizeof(line)) == NULL) printf("Invalid parameter : csMap.xMax.\n");
	if (fprintf(fileout, "%.10g\n", csMap.xMax) < 0) printf("Error writing parameter : csMap.xMax.\n");

	if (fclose(fileout) != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		fclose(filein);
		return EXIT_FAILURE;
	}
	if (fclose(filein) != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}

	if (remove("env.txt") != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}
	if (rename("~env.txt", "env.txt") != EXIT_SUCCESS)
	{
		printf("Error saving configuration file.\n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}